

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

_Bool arena_decay_ms_set(tsdn_t *tsdn,arena_t *arena,arena_decay_t *decay,extents_t *extents,
                        ssize_t decay_ms)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  mutex_prof_data_t *data;
  
  if (0xffffef39085f50bd < decay_ms - 0x10c6f7a0af41U) {
    __mutex = (pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x40);
    iVar3 = pthread_mutex_trylock(__mutex);
    if (iVar3 != 0) {
      malloc_mutex_lock_slow(&decay->mtx);
      (decay->mtx).field_0.field_0.locked.repr = true;
    }
    puVar1 = &(decay->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if ((decay->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (decay->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar2 = &(decay->mtx).field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    arena_decay_reinit(decay,decay_ms);
    arena_maybe_decay(tsdn,arena,decay,extents,false);
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
  return decay_ms - 0x10c6f7a0af41U < 0xffffef39085f50be;
}

Assistant:

static bool
arena_decay_ms_set(tsdn_t *tsdn, arena_t *arena, arena_decay_t *decay,
    extents_t *extents, ssize_t decay_ms) {
	if (!arena_decay_ms_valid(decay_ms)) {
		return true;
	}

	malloc_mutex_lock(tsdn, &decay->mtx);
	/*
	 * Restart decay backlog from scratch, which may cause many dirty pages
	 * to be immediately purged.  It would conceptually be possible to map
	 * the old backlog onto the new backlog, but there is no justification
	 * for such complexity since decay_ms changes are intended to be
	 * infrequent, either between the {-1, 0, >0} states, or a one-time
	 * arbitrary change during initial arena configuration.
	 */
	arena_decay_reinit(decay, decay_ms);
	arena_maybe_decay(tsdn, arena, decay, extents, false);
	malloc_mutex_unlock(tsdn, &decay->mtx);

	return false;
}